

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.h
# Opt level: O1

RefractDataOut cert::refract_func(Vec3 *v,Vec3 *n,float ni_over_nt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  RefractDataOut RVar4;
  float fVar5;
  double dVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  int local_48;
  undefined8 uStack_44;
  
  dVar6 = sqrt((double)(ulong)(uint)(v->z * v->z + v->x * v->x + v->y * v->y));
  fVar11 = SUB84(dVar6,0);
  fVar9 = v->x / fVar11;
  fVar10 = v->y / fVar11;
  fVar11 = v->z / fVar11;
  fVar1 = n->x;
  fVar2 = n->y;
  fVar3 = n->z;
  fVar7 = fVar11 * fVar3 + fVar9 * fVar1 + fVar10 * fVar2;
  fVar5 = 1.0 - (1.0 - fVar7 * fVar7) * ni_over_nt * ni_over_nt;
  fVar8 = 0.0;
  if (fVar5 <= 0.0) {
    local_48 = (uint)local_48._1_3_ << 8;
    uStack_44 = 0;
  }
  else {
    local_48 = CONCAT31(local_48._1_3_,1);
    dVar6 = sqrt((double)(ulong)(uint)fVar5);
    fVar5 = SUB84(dVar6,0);
    fVar8 = (fVar11 - fVar3 * fVar7) * ni_over_nt - fVar5 * n->z;
    uStack_44 = CONCAT44((fVar10 - fVar2 * fVar7) * ni_over_nt - n->y * fVar5,
                         (fVar9 - fVar1 * fVar7) * ni_over_nt - n->x * fVar5);
  }
  RVar4.refracted.x = (float)(undefined4)uStack_44;
  RVar4.refracted.y = (float)uStack_44._4_4_;
  RVar4._0_4_ = local_48;
  RVar4.refracted.z = fVar8;
  return RVar4;
}

Assistant:

constexpr RefractDataOut refract_func (Vec3 const& v, Vec3 const& n, float ni_over_nt)
{
	Vec3 uv = normalize (v);
	float dt = dot (uv, n);
	float discriminant = 1.0 - ni_over_nt * ni_over_nt * (1 - dt * dt);
	if (discriminant > 0)
	{
		return { true, ni_over_nt * (uv - n * dt) - n * sqrt (discriminant) };
	}
	else
		return { false };
}